

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O0

int main(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  weak_ptr<vmips::Function> local_280;
  weak_ptr<vmips::Function> local_270;
  weak_ptr<vmips::Function> local_260;
  shared_ptr<vmips::VirtReg> local_250;
  undefined1 local_240 [8];
  shared_ptr<vmips::VirtReg> addr;
  undefined1 local_220 [8];
  shared_ptr<vmips::VirtReg> waddr;
  undefined1 local_208 [8];
  shared_ptr<vmips::VirtReg> fd;
  undefined1 local_1f0 [8];
  shared_ptr<vmips::VirtReg> size;
  shared_ptr<vmips::Data> greetings;
  string local_1c8 [32];
  undefined1 local_1a8 [8];
  shared_ptr<vmips::Function> f;
  string local_190 [32];
  undefined1 local_170 [8];
  shared_ptr<vmips::Function> free;
  string local_158 [32];
  undefined1 local_138 [8];
  shared_ptr<vmips::Function> memcpy;
  string local_120 [32];
  undefined1 local_100 [8];
  shared_ptr<vmips::Function> malloc;
  string local_e8 [32];
  undefined1 local_c8 [8];
  shared_ptr<vmips::Function> write;
  allocator local_a1;
  string local_a0 [32];
  Module local_80 [8];
  Module module;
  char data [15];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"test",&local_a1);
  vmips::Module::Module(local_80,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e8,"write",
             (allocator *)
             ((long)&malloc.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  vmips::Module::create_extern(local_c8,local_80,local_e8,3);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&malloc.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_120,"malloc",
             (allocator *)
             ((long)&memcpy.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  vmips::Module::create_extern(local_100,local_80,local_120,1);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&memcpy.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,"memcpy",
             (allocator *)
             ((long)&free.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  vmips::Module::create_extern(local_138,local_80,local_158,3);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&free.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_190,"free",
             (allocator *)
             ((long)&f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  vmips::Module::create_extern(local_170,local_80,local_190,1);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&f.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c8,"main",
             (allocator *)
             ((long)&greetings.super___shared_ptr<vmips::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  vmips::Module::create_function(local_1a8,local_80,local_1c8,3);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&greetings.super___shared_ptr<vmips::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  vmips::Function::create_data<vmips::asciiz,char(&)[15]>
            ((Function *)
             &size.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             SUB81(peVar1,0),(char (*) [15])0x1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  fd.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  vmips::Function::append<vmips::li,unsigned_long>((Function *)local_1f0,(unsigned_long *)peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  waddr.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  vmips::Function::append<vmips::li,int>((Function *)local_208,(int *)peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  vmips::Function::append<vmips::la,std::shared_ptr<vmips::Data>&>
            ((Function *)local_220,(shared_ptr<vmips::Data> *)peVar1);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  this = &addr.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::weak_ptr<vmips::Function>::weak_ptr<vmips::Function,void>
            ((weak_ptr<vmips::Function> *)this,(shared_ptr<vmips::Function> *)local_c8);
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (peVar1,(weak_ptr<vmips::Function> *)this,(shared_ptr<vmips::VirtReg> *)local_208,
             (shared_ptr<vmips::VirtReg> *)local_220,(shared_ptr<vmips::VirtReg> *)local_1f0);
  std::weak_ptr<vmips::Function>::~weak_ptr
            ((weak_ptr<vmips::Function> *)
             &addr.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  std::weak_ptr<vmips::Function>::weak_ptr<vmips::Function,void>
            ((weak_ptr<vmips::Function> *)&local_250,(shared_ptr<vmips::Function> *)local_100);
  vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
            ((Function *)local_240,(weak_ptr<vmips::Function> *)peVar1,&local_250);
  std::weak_ptr<vmips::Function>::~weak_ptr((weak_ptr<vmips::Function> *)&local_250);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  std::weak_ptr<vmips::Function>::weak_ptr<vmips::Function,void>
            (&local_260,(shared_ptr<vmips::Function> *)local_138);
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (peVar1,&local_260,(shared_ptr<vmips::VirtReg> *)local_240,
             (shared_ptr<vmips::VirtReg> *)local_220,(shared_ptr<vmips::VirtReg> *)local_1f0);
  std::weak_ptr<vmips::Function>::~weak_ptr(&local_260);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  std::weak_ptr<vmips::Function>::weak_ptr<vmips::Function,void>
            (&local_270,(shared_ptr<vmips::Function> *)local_c8);
  vmips::Function::
  call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (peVar1,&local_270,(shared_ptr<vmips::VirtReg> *)local_208,
             (shared_ptr<vmips::VirtReg> *)local_220,(shared_ptr<vmips::VirtReg> *)local_1f0);
  std::weak_ptr<vmips::Function>::~weak_ptr(&local_270);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  std::weak_ptr<vmips::Function>::weak_ptr<vmips::Function,void>
            (&local_280,(shared_ptr<vmips::Function> *)local_170);
  vmips::Function::call_void<std::shared_ptr<vmips::VirtReg>&>
            (peVar1,&local_280,(shared_ptr<vmips::VirtReg> *)local_240);
  std::weak_ptr<vmips::Function>::~weak_ptr(&local_280);
  peVar1 = std::__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<vmips::Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1a8);
  vmips::Function::assign_special((SpecialReg)peVar1,2);
  vmips::Module::finalize(local_80);
  vmips::Module::output((ostream *)local_80);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_240);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_220);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_208);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr((shared_ptr<vmips::VirtReg> *)local_1f0);
  std::shared_ptr<vmips::Data>::~shared_ptr
            ((shared_ptr<vmips::Data> *)
             &size.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)local_1a8);
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)local_170);
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)local_138);
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)local_100);
  std::shared_ptr<vmips::Function>::~shared_ptr((shared_ptr<vmips::Function> *)local_c8);
  vmips::Module::~Module(local_80);
  return 0;
}

Assistant:

int main() {
    char data[] = "hello, world!\n";
    auto module = Module("test");
    auto write = module.create_extern("write", 3);
    auto malloc = module.create_extern("malloc", 1);
    auto memcpy = module.create_extern("memcpy", 3);
    auto free = module.create_extern("free", 1);
    auto f = module.create_function("main", 3);
    auto greetings = f->create_data<asciiz>(true, data );
    auto size = f->append<li>(sizeof(data));
    auto fd = f->append<li>(0);
    auto waddr = f->append<la>(greetings);
    f->call_void(write, fd, waddr, size);
    auto addr = f->call(malloc, size);
    f->call_void(memcpy, addr, waddr, size);
    f->call_void(write, fd, waddr, size);
    f->call_void(free, addr);
    f->assign_special(SpecialReg::v0, 0);
    module.finalize();
    module.output(std::cout);
}